

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<prometheus::(anonymous_namespace)::IntegrationTest_shouldSendBodyAsUtf8_Test>::
CreateTest(TestFactoryImpl<prometheus::(anonymous_namespace)::IntegrationTest_shouldSendBodyAsUtf8_Test>
           *this)

{
  IntegrationTest *this_00;
  
  this_00 = (IntegrationTest *)operator_new(0x78);
  prometheus::anon_unknown_0::IntegrationTest::IntegrationTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__IntegrationTest_00185128;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }